

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_FourClosedTriplets_TestShell::
~TEST_DoublingFactorCounterTest_FourClosedTriplets_TestShell
          (TEST_DoublingFactorCounterTest_FourClosedTriplets_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, FourClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::FourClosedTriplets));
	CHECK_EQUAL(100, r.doubling_factor);
}